

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int parse_value(frozen *f)

{
  int iVar1;
  int _n_6;
  int _n_5;
  int _n_4;
  int _n_3;
  int _n_2;
  int _n_1;
  int _n;
  int ch;
  frozen *f_local;
  
  iVar1 = cur(f);
  switch(iVar1) {
  case 0x22:
    f_local._4_4_ = parse_string(f);
    break;
  default:
    if (iVar1 != -1) {
      return -1;
    }
    return -2;
  case 0x2d:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    iVar1 = parse_number(f);
    goto joined_r0x00117bff;
  case 0x5b:
    iVar1 = parse_array(f);
joined_r0x00117bff:
    if (iVar1 < 0) {
      return iVar1;
    }
    goto LAB_00117cde;
  case 0x66:
    f_local._4_4_ = expect(f,"false",5,JSON_TYPE_FALSE);
    break;
  case 0x6e:
    f_local._4_4_ = expect(f,"null",4,JSON_TYPE_NULL);
    break;
  case 0x74:
    f_local._4_4_ = expect(f,"true",4,JSON_TYPE_TRUE);
    break;
  case 0x7b:
    f_local._4_4_ = parse_object(f);
  }
  if (-1 < f_local._4_4_) {
LAB_00117cde:
    f_local._4_4_ = 0;
  }
  return f_local._4_4_;
}

Assistant:

static int parse_value(struct frozen *f) {
    int ch = cur(f);

    switch (ch) {
        case '"':
            TRY(parse_string(f));
            break;
        case '{':
            TRY(parse_object(f));
            break;
        case '[':
            TRY(parse_array(f));
            break;
        case 'n':
            TRY(expect(f, "null", 4, JSON_TYPE_NULL));
            break;
        case 't':
            TRY(expect(f, "true", 4, JSON_TYPE_TRUE));
            break;
        case 'f':
            TRY(expect(f, "false", 5, JSON_TYPE_FALSE));
            break;
        case '-':
        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7':
        case '8':
        case '9':
            TRY(parse_number(f));
            break;
        default:
            return ch == END_OF_STRING ? JSON_STRING_INCOMPLETE : JSON_STRING_INVALID;
    }

    return 0;
}